

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  cmLocalGenerator *localGenerator;
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar9;
  cmGeneratorExpressionInterpreter *this;
  ostream *poVar10;
  size_t sVar11;
  pointer ppcVar12;
  char *pcVar13;
  bool bVar14;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string reportEntry;
  string report;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  uint local_2f8;
  cmGeneratorExpressionInterpreter *local_2e8;
  string local_2e0;
  cmGeneratorTarget *local_2c0;
  string local_2b8;
  string *local_298;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  _Base_ptr local_250;
  _Base_ptr local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  char *local_238;
  pointer local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  pointer local_220;
  string local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string local_1e0 [3];
  ios_base local_170 [264];
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  bVar6 = cmTarget::GetPropertyAsBool(tgt->Target,p);
  local_2f8 = (uint)bVar6;
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_48,tgt);
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar14 = _Var8._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_248 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_240 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_250 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_248 != local_250 &&
      _Var8._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x11f0,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  pvVar9 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar9->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar9->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290," * Target \"","");
    std::__cxx11::string::_M_append((char *)&local_290,(ulong)(tgt->Target->Name)._M_dataplus._M_p);
    local_2c0 = tgt;
    if (_Var8._M_current != local_240) {
      std::__cxx11::string::append((char *)&local_290);
      pcVar13 = "FALSE";
      if (bVar6) {
        pcVar13 = "TRUE";
      }
      local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,pcVar13,pcVar13 + ((ulong)bVar6 ^ 5));
      std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1e0[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
        operator_delete(local_1e0[0]._M_dataplus._M_p,local_1e0[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    pcVar2 = local_2c0;
    std::__cxx11::string::append((char *)&local_290);
    local_238 = defaultValue;
    local_228 = _Var8._M_current;
    std::operator+(&local_270,"INTERFACE_",p);
    iVar7 = std::__cxx11::string::compare((char *)p);
    if (iVar7 == 0) {
      this = (cmGeneratorExpressionInterpreter *)operator_new(0x68);
      localGenerator = pcVar2->LocalGenerator;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      pcVar1 = (config->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,pcVar1,pcVar1 + config->_M_string_length);
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (this,localGenerator,&local_218,local_2c0,&local_68);
      local_2e8 = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      local_2e8 = (cmGeneratorExpressionInterpreter *)0x0;
    }
    if ((iVar7 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2)) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    ppcVar12 = (pvVar9->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_230 = (pvVar9->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar12 != local_230) {
      local_298 = p;
      do {
        pcVar2 = *ppcVar12;
        local_220 = ppcVar12;
        cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_1f8,pcVar2);
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_270);
        pbVar5 = local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = local_240;
        bVar6 = getTypedProperty<bool>(pcVar2,&local_270,local_2e8);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        local_2e0._M_string_length = 0;
        local_2e0.field_2._M_local_buf[0] = '\0';
        if (_Var8._M_current != pbVar5) {
          std::__cxx11::string::append((char *)&local_2e0);
          std::__cxx11::string::_M_append
                    ((char *)&local_2e0,(ulong)(pcVar2->Target->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_2e0);
          pcVar13 = "FALSE";
          if (bVar6) {
            pcVar13 = "TRUE";
          }
          local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1e0,pcVar13,pcVar13 + ((ulong)bVar6 ^ 5));
          std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1e0[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
            operator_delete(local_1e0[0]._M_dataplus._M_p,
                            local_1e0[0].field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_2e0);
        }
        if (local_228 == pbVar4) {
          if (local_248 == local_250) {
            iVar7 = 3;
            if (_Var8._M_current == pbVar5) goto LAB_0028ddbd;
            if (bVar14) {
              std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2e0._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_(local_1e0,t,false);
              std::__cxx11::string::_M_append
                        ((char *)&local_290,(ulong)local_1e0[0]._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
                operator_delete(local_1e0[0]._M_dataplus._M_p,
                                local_1e0[0].field_2._M_allocated_capacity + 1);
              }
              if (bVar6 != local_2f8._0_1_) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e0,"The INTERFACE_",0xe);
                psVar3 = local_298;
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,(local_298->_M_dataplus)._M_p,
                                     local_298->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," property of \"",0xe);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(pcVar2->Target->Name)._M_dataplus._M_p,
                                     (pcVar2->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" does\nnot agree with the value of ",0x23);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," already determined\nfor \"",0x19);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(local_2c0->Target->Name)._M_dataplus._M_p,
                                     (local_2c0->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_2b8);
                goto LAB_0028daa8;
              }
            }
            else {
              local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1e0,local_2e0._M_dataplus._M_p,
                         local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
              std::__cxx11::string::append((char *)local_1e0);
              std::__cxx11::string::_M_append
                        ((char *)&local_290,(ulong)local_1e0[0]._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
                operator_delete(local_1e0[0]._M_dataplus._M_p,
                                local_1e0[0].field_2._M_allocated_capacity + 1);
              }
              iVar7 = 0;
              bVar14 = true;
              local_2f8 = (uint)bVar6;
            }
          }
          else {
            iVar7 = 3;
            if (_Var8._M_current == pbVar5) {
              local_2f8 = 0;
LAB_0028ddbd:
              iVar7 = 3;
            }
            else {
              std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2e0._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_(local_1e0,t,false);
              std::__cxx11::string::_M_append
                        ((char *)&local_290,(ulong)local_1e0[0]._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
                operator_delete(local_1e0[0]._M_dataplus._M_p,
                                local_1e0[0].field_2._M_allocated_capacity + 1);
              }
              if (bVar6) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e0,"Property ",9);
                psVar3 = local_298;
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,(local_298->_M_dataplus)._M_p,
                                     local_298->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," on target \"",0xc);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(local_2c0->Target->Name)._M_dataplus._M_p,
                                     (local_2c0->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" is\nimplied to be ",0x13);
                pcVar13 = local_238;
                if (local_238 == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar11 = strlen(local_238);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar13,sVar11);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," property on\ndependency \"",0x19);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(pcVar2->Target->Name)._M_dataplus._M_p,
                                     (pcVar2->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_2b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                  operator_delete(local_2b8._M_dataplus._M_p,
                                  local_2b8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
                std::ios_base::~ios_base(local_170);
                iVar7 = 2;
                local_2f8 = 0;
              }
              else {
                local_2f8 = 0;
              }
            }
          }
        }
        else {
          iVar7 = 3;
          if (_Var8._M_current == pbVar5) goto LAB_0028ddbd;
          std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2e0._M_dataplus._M_p);
          compatibilityAgree_abi_cxx11_(local_1e0,t,false);
          std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1e0[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
            operator_delete(local_1e0[0]._M_dataplus._M_p,
                            local_1e0[0].field_2._M_allocated_capacity + 1);
          }
          if (bVar6 != local_2f8._0_1_) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Property ",9);
            psVar3 = local_298;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e0,(local_298->_M_dataplus)._M_p,
                                 local_298->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," on target \"",0xc);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(local_2c0->Target->Name)._M_dataplus._M_p,
                                 (local_2c0->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"\" does\nnot match the INTERFACE_",0x1f);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10," property requirement\nof dependency \"",0x25);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(pcVar2->Target->Name)._M_dataplus._M_p,
                                 (pcVar2->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".\n",3);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_2b8);
LAB_0028daa8:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
            std::ios_base::~ios_base(local_170);
            iVar7 = 2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                                   local_2e0.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1f8);
        p = local_298;
      } while (((iVar7 == 3) || (iVar7 == 0)) && (ppcVar12 = local_220 + 1, ppcVar12 != local_230));
    }
    iVar7 = 0x4849e5;
    if (local_2f8 != 0) {
      iVar7 = 0x4849e0;
    }
    local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,iVar7,(local_2f8 ^ 5) + iVar7);
    compatibilityType_abi_cxx11_(&local_2e0,t);
    cmGeneratorTarget::ReportPropertyOrigin(local_2c0,p,local_1e0,&local_290,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,
                      CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                               local_2e0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
      operator_delete(local_1e0[0]._M_dataplus._M_p,local_1e0[0].field_2._M_allocated_capacity + 1);
    }
    if (local_2e8 != (cmGeneratorExpressionInterpreter *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2e8,local_2e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    bVar6 = local_2f8._0_1_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
  }
  local_2f8._0_1_ = bVar6;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2f8._0_1_;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}